

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-docstate.c
# Opt level: O2

int fy_document_state_merge(fy_document_state *fyds,fy_document_state *fydsc)

{
  byte bVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  _Bool _Var5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  char *__s1;
  fy_token *pfVar9;
  fy_token *fyt;
  size_t tdc_prefix_size;
  size_t tdc_handle_size;
  size_t td_prefix_size;
  
  if (fydsc == (fy_document_state *)0x0 || fyds == (fy_document_state *)0x0) {
    return -1;
  }
  pfVar9 = (fy_token *)(fydsc->fyt_td)._lh.next;
  do {
    fyt = (fy_token *)0x0;
    if (pfVar9 != (fy_token *)&fydsc->fyt_td) {
      fyt = pfVar9;
    }
    if (fyt == (fy_token *)0x0) {
      bVar1 = fyds->field_0x1c;
      bVar6 = fydsc->field_0x1c & 1;
      fyds->field_0x1c = bVar6 | bVar1;
      fyds->field_0x1c = bVar6 | bVar1 & 0xfd | (bVar1 | fydsc->field_0x1c) & 2;
      iVar7 = (fyds->version).major;
      iVar2 = (fydsc->version).major;
      if (iVar2 <= iVar7) {
        if (iVar7 != iVar2) {
          return 0;
        }
        if ((fydsc->version).minor <= (fyds->version).minor) {
          return 0;
        }
      }
      fyds->version = fydsc->version;
      return 0;
    }
    pcVar8 = fy_tag_directive_token_handle(fyt,&tdc_handle_size);
    if (pcVar8 == (char *)0x0) {
      return -1;
    }
    __s1 = fy_tag_directive_token_prefix(fyt,&tdc_prefix_size);
    if (__s1 == (char *)0x0) {
      return -1;
    }
    pfVar9 = fy_document_state_lookup_tag_directive(fyds,pcVar8,tdc_handle_size);
    if (pfVar9 == (fy_token *)0x0) {
LAB_00138f33:
      pfVar9 = fy_token_create(FYTT_TAG_DIRECTIVE,&fyt->handle,
                               (ulong)(fyt->field_9).tag_directive.tag_length,
                               (ulong)(fyt->field_9).tag_directive.uri_length);
      if (pfVar9 == (fy_token *)0x0) {
        return -1;
      }
      plVar3 = (fyds->fyt_td)._lh.prev;
      (fyds->fyt_td)._lh.prev = &pfVar9->node;
      (pfVar9->node).next = &(fyds->fyt_td)._lh;
      (pfVar9->node).prev = plVar3;
      plVar3->next = &pfVar9->node;
    }
    else {
      pcVar8 = fy_tag_directive_token_prefix(pfVar9,&td_prefix_size);
      if (pcVar8 == (char *)0x0) {
        __assert_fail("td_prefix",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-docstate.c"
                      ,0x107,
                      "int fy_document_state_merge(struct fy_document_state *, struct fy_document_state *)"
                     );
      }
      if ((tdc_prefix_size != td_prefix_size) ||
         (iVar7 = bcmp(__s1,pcVar8,tdc_prefix_size), iVar7 != 0)) {
        _Var5 = fy_token_tag_directive_is_overridable(pfVar9);
        if (!_Var5) {
          return -1;
        }
        plVar3 = (pfVar9->node).next;
        plVar4 = (pfVar9->node).prev;
        plVar3->prev = plVar4;
        plVar4->next = plVar3;
        (pfVar9->node).next = &pfVar9->node;
        (pfVar9->node).prev = &pfVar9->node;
        fy_token_unref(pfVar9);
        goto LAB_00138f33;
      }
    }
    pfVar9 = (fy_token *)(fyt->node).next;
  } while( true );
}

Assistant:

int fy_document_state_merge(struct fy_document_state *fyds,
                            struct fy_document_state *fydsc) {
    const char *td_prefix, *tdc_handle, *tdc_prefix;
    size_t td_prefix_size, tdc_handle_size, tdc_prefix_size;
    struct fy_token *fyt, *fytc_td, *fyt_td;

    if (!fyds || !fydsc)
        return -1;

    /* check if there's a duplicate handle (which differs */
    for (fytc_td = fy_token_list_first(&fydsc->fyt_td); fytc_td;
         fytc_td = fy_token_next(&fydsc->fyt_td, fytc_td)) {

        tdc_handle = fy_tag_directive_token_handle(fytc_td, &tdc_handle_size);
        if (!tdc_handle)
            goto err_out;
        tdc_prefix = fy_tag_directive_token_prefix(fytc_td, &tdc_prefix_size);
        if (!tdc_prefix)
            goto err_out;

        fyt_td = fy_document_state_lookup_tag_directive(fyds, tdc_handle, tdc_handle_size);
        if (fyt_td) {
            /* exists, must check whether the prefixes match */
            td_prefix = fy_tag_directive_token_prefix(fyt_td, &td_prefix_size);
            assert(td_prefix);

            /* match? do nothing */
            if (tdc_prefix_size == td_prefix_size &&
                !memcmp(tdc_prefix, td_prefix, td_prefix_size))
                continue;

            if (!fy_token_tag_directive_is_overridable(fyt_td))
                goto err_out;

            /* override tag directive */
            fy_token_list_del(&fyds->fyt_td, fyt_td);
            fy_token_unref(fyt_td);
        }

        fyt = fy_token_create(FYTT_TAG_DIRECTIVE,
                              &fytc_td->handle,
                              fytc_td->tag_directive.tag_length,
                              fytc_td->tag_directive.uri_length);
        if (!fyt)
            goto err_out;

        fy_token_list_add_tail(&fyds->fyt_td, fyt);
    }

    /* merge other document state */
    fyds->version_explicit |= fydsc->version_explicit;
    fyds->tags_explicit |= fydsc->tags_explicit;

    if (fyds->version.major < fydsc->version.major ||
        (fyds->version.major == fydsc->version.major &&
         fyds->version.minor < fydsc->version.minor))
        fyds->version = fydsc->version;

    return 0;

    err_out:
    return -1;
}